

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O2

Iterator * __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::Iterator::operator++(Iterator *this)

{
  unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
  *this_00;
  pointer *ppWVar1;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *pSVar2;
  HeapType *pHVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  pointer pWVar5;
  _Storage<wasm::HeapType,_true> _Var6;
  pointer pHVar7;
  vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
  *this_01;
  pointer pWVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *__node;
  size_t __c;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *pSVar11;
  size_type sVar12;
  pointer pWVar13;
  ulong uVar14;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *pSVar15;
  size_type in_R8;
  HeapType local_c0;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_b8;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *local_a0;
  pointer local_98;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_90;
  key_type local_88;
  optional<wasm::HeapType> *local_80;
  vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
  *local_78;
  Iterator *local_70;
  undefined1 local_68 [8];
  Iterator __begin0;
  
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)(this->scc).parent;
  SCC::begin((Iterator *)local_68,(SCC *)&local_b8);
  while ((local_68 != (undefined1  [8])0x0 && (*(bool *)((long)local_68 + 0x90) != false))) {
    SCC::Iterator::operator++((Iterator *)local_68);
  }
  pSVar2 = (this->scc).parent;
  local_78 = &pSVar2->workStack;
  this_00 = &pSVar2->elementInfo;
  local_90 = &pSVar2->stack;
  local_80 = &pSVar2->currParent;
  local_a0 = pSVar2 + 1;
  pWVar8 = (pSVar2->workStack).
           super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pWVar13 = (pSVar2->workStack).
            super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = this;
  do {
    pHVar3 = (pSVar2->inputIt)._M_current;
    if ((pHVar3 == (pSVar2->inputEnd)._M_current) && (pWVar13 == pWVar8)) {
      (local_70->scc).parent =
           (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
            *)0x0;
      return local_70;
    }
    if (pWVar13 == pWVar8) {
      (pSVar2->inputIt)._M_current = pHVar3 + 1;
      local_68 = (undefined1  [8])pHVar3->id;
      __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)
           ((ulong)__begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload & 0xffffffffffffff00);
      __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
      std::
      vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
      ::push_back(local_78,(value_type *)local_68);
    }
    while( true ) {
      pWVar8 = (pSVar2->workStack).
               super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pWVar5 = (pSVar2->workStack).
               super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pWVar13 = pWVar8;
      if (pWVar8 == pWVar5) break;
      pWVar8 = pWVar5 + -1;
      if (pWVar5[-1].processedChildren == false) {
        pWVar13 = (pointer)(pSVar2->elementInfo)._M_h._M_element_count;
        aVar4 = (anon_struct_8_0_00000001_for___align)(pWVar8->item).id;
        local_98 = pWVar8;
        local_68 = (undefined1  [8])this_00;
        __node = (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                  *)operator_new(0x30);
        (__node->inputIt)._M_current = (HeapType *)0x0;
        (((_Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
           *)&__node->inputEnd)->
        super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
        )._M_storage._M_storage.__align = aVar4;
        (__node->workStack).
        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_start = pWVar13;
        (__node->workStack).
        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_finish = pWVar13;
        *(undefined1 *)
         &(__node->workStack).
          super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
        __begin0.parent = __node;
        __c = std::hash<wasm::HeapType>::operator()
                        ((hash<wasm::HeapType> *)this_00,(HeapType *)&__node->inputEnd);
        uVar14 = __c % (pSVar2->elementInfo)._M_h._M_bucket_count;
        pSVar11 = (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                   *)std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::_M_find_node(&this_00->_M_h,uVar14,(key_type *)&__node->inputEnd,__c);
        pSVar15 = pSVar11;
        if (pSVar11 ==
            (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
             *)0x0) {
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_insert_unique_node(&this_00->_M_h,uVar14,__c,(__node_ptr)__node,in_R8);
          __begin0.parent =
               (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                *)0x0;
          pSVar15 = __node;
        }
        std::
        _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Scoped_node::~_Scoped_node((_Scoped_node *)local_68);
        pWVar8 = local_98;
        if (pSVar11 !=
            (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
             *)0x0) {
          if (*(char *)&(pSVar15->workStack).
                        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
            if (pWVar5[-1].parent.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
              __assert_fail("work.parent",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                            ,0x6e,
                            "bool wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::stepToNextGroup() [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
                           );
            }
            pmVar9 = std::
                     unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                     ::operator[](this_00,(key_type *)&pWVar5[-1].parent);
            pWVar8 = (pSVar15->workStack).
                     super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pWVar13 = (pointer)pmVar9->lowlink;
            if (pWVar8 < (pointer)pmVar9->lowlink) {
              pWVar13 = pWVar8;
            }
            pmVar9->lowlink = (size_t)pWVar13;
          }
          goto LAB_00aa4685;
        }
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (local_90,&local_98->item);
        pWVar5[-1].processedChildren = true;
        _Var6 = (_Storage<wasm::HeapType,_true>)pWVar5[-1].item.id;
        if ((pSVar2->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
          (pSVar2->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
        }
        (local_80->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload = _Var6;
        local_c0.id = (pWVar8->item).id;
        HeapType::getReferencedHeapTypes
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_b8,&local_c0);
        this_01 = local_78;
        pHVar7 = local_b8._M_impl.super__Vector_impl_data._M_finish;
        for (pSVar15 = (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                        *)local_b8._M_impl.super__Vector_impl_data._M_start;
            pSVar15 !=
            (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
             *)pHVar7;
            pSVar15 = (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                       *)&pSVar15->inputEnd) {
          local_88.id = (uintptr_t)(pSVar15->inputIt)._M_current;
          sVar12 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_a0,&local_88);
          if (sVar12 != 0) {
            if ((pSVar2->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
              __assert_fail("currParent",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                            ,0xa9,
                            "void wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::push(const T &) [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
                           );
            }
            local_68 = (undefined1  [8])local_88.id;
            __begin0.parent =
                 *(SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                   **)&(local_80->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
            __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload =
                 *(_Storage<wasm::HeapType,_true> *)
                  &(local_80->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_engaged;
            __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
            std::
            vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
            ::push_back(this_01,(value_type *)local_68);
          }
        }
        std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_b8)
        ;
        if ((pSVar2->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
          (pSVar2->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
        }
      }
      else {
        pmVar9 = std::
                 unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                 ::operator[](this_00,&pWVar8->item);
        if (pWVar5[-1].parent.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
          pmVar10 = std::
                    unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                    ::operator[](this_00,(key_type *)&pWVar5[-1].parent);
          uVar14 = pmVar10->lowlink;
          if (pmVar9->lowlink < pmVar10->lowlink) {
            uVar14 = pmVar9->lowlink;
          }
          pmVar10->lowlink = uVar14;
        }
        if (pmVar9->index == pmVar9->lowlink) {
          _Var6 = (_Storage<wasm::HeapType,_true>)(pWVar8->item).id;
          if ((pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
            (pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
          }
          (pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload = _Var6;
          ppWVar1 = &(pSVar2->workStack).
                     super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + -1;
          return local_70;
        }
LAB_00aa4685:
        ppWVar1 = &(pSVar2->workStack).
                   super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppWVar1 = *ppWVar1 + -1;
      }
    }
  } while( true );
}

Assistant:

Iterator& operator++() {
      // Skip the rest of the current SCC, if for some reason it was not
      // consumed.
      for (auto elem : *(*this)) {
        (void)elem;
      }
      if (!scc.parent->stepToNextGroup()) {
        // We are at the end, so mark ourselves as such.
        scc.parent = nullptr;
      }
      return *this;
    }